

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Dimension_UnknownDimension::~Dimension_UnknownDimension
          (Dimension_UnknownDimension *this)

{
  ~Dimension_UnknownDimension(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

Dimension_UnknownDimension::~Dimension_UnknownDimension() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.Dimension.UnknownDimension)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}